

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O2

void grasshopper_set_decrypt_key(grasshopper_round_keys_t *subkeys,grasshopper_key_t *key)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  uint j;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  
  grasshopper_set_encrypt_key(subkeys,key);
  puVar6 = (undefined1 *)((long)subkeys->k + 0x11);
  for (lVar5 = 1; lVar5 != 10; lVar5 = lVar5 + 1) {
    for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
      bVar3 = subkeys->k[lVar5].b[0];
      for (lVar2 = 0; lVar2 != 0xf; lVar2 = lVar2 + 1) {
        puVar6[lVar2 + -1] = puVar6[lVar2];
        bVar1 = grasshopper_galois_mul(puVar6[lVar2],grasshopper_lvec[lVar2]);
        bVar3 = bVar3 ^ bVar1;
      }
      subkeys->k[lVar5].b[0xf] = bVar3;
    }
    puVar6 = puVar6 + 0x10;
  }
  return;
}

Assistant:

void grasshopper_set_decrypt_key(grasshopper_round_keys_t* subkeys, const grasshopper_key_t* key) {
		int i;
    grasshopper_set_encrypt_key(subkeys, key);

    for (i = 1; i < 10; i++) {
        grasshopper_l_inv(&subkeys->k[i]);
    }
}